

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void fmt::v8::detail::value<fmt::v8::basic_format_context<fmt::v8::appender,char>>::
     format_custom_arg<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>,fmt::v8::formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v8::appender,_char> *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  undefined8 in_RAX;
  iterator pcVar3;
  iterator iVar4;
  undefined6 local_28;
  undefined2 uStack_22;
  
  _local_28 = CONCAT26((short)((ulong)in_RAX >> 0x30),0x100010120);
  pcVar3 = formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>,char,void>
           ::parse<fmt::v8::basic_format_parse_context<char,fmt::v8::detail::error_handler>>
                     ((formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>,char,void>
                       *)&local_28,parse_ctx);
  pcVar2 = (parse_ctx->format_str_).data_;
  (parse_ctx->format_str_).data_ = pcVar3;
  psVar1 = &(parse_ctx->format_str_).size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)pcVar3));
  iVar4 = formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>,char,void>
          ::
          format<fmt::v8::basic_format_context<fmt::v8::appender,char>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                    ((formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>,char,void>
                      *)&local_28,
                     (dump_info<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
                      *)arg,ctx);
  (ctx->out_).super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
       (buffer<char> *)iVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  return;
}

Assistant:

static void format_custom_arg(const void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    Formatter f;
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }